

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatevulnerability.cpp
# Opt level: O2

void __thiscall ValidateVulnerability::ReadVulnerabilityFile(ValidateVulnerability *this)

{
  Validate *this_00;
  int iVar1;
  char *pcVar2;
  float local_30;
  OASIS_FLOAT local_2c;
  
  local_2c = 0.0;
  ReadFirstVulnerabilityLine(this,&local_2c);
  if (this->convertToBin_ == true) {
    (**this->_vptr_ValidateVulnerability)(this);
  }
  this_00 = &this->super_Validate;
  local_30 = local_2c;
  while( true ) {
    pcVar2 = fgets(this_00->line_,0x1000,_stdin);
    if (pcVar2 == (char *)0x0) break;
    iVar1 = ScanLine(this);
    if (iVar1 == 4) {
      CheckVulnerabilityID(this);
      if (((this->v_).vulnerability_id == this->prevVulID_) &&
         ((this->v_).intensity_bin_id == this->prevIntBinID_)) {
        local_30 = local_30 + (this->v_).probability;
      }
      else {
        CheckProbability(this,local_30);
        if ((this->v_).vulnerability_id == this->prevVulID_) {
          CheckIntensityBinID(this);
        }
        if (this->allIntensityBinsCheck_ == true) {
          SetIntensityBinIDs(this);
        }
        if ((this->useIndexFile_ == true) && ((this->v_).vulnerability_id != this->prevVulID_)) {
          (*this->_vptr_ValidateVulnerability[1])(this);
        }
        this->prevDamageBinID_ = 0;
        local_30 = (this->v_).probability;
      }
      CheckDamageBinID(this);
      if (this->convertToBin_ == true) {
        (**this->_vptr_ValidateVulnerability)(this);
      }
      StoreLine(this);
    }
    else {
      fprintf(_stderr,"ERROR: Invalid data in line %d:\n%s\n",
              (ulong)(uint)(this->super_Validate).lineno_,this_00);
      Validate::PrintErrorMessage(this_00);
    }
  }
  CheckProbability(this,local_30);
  if (((this->v_).vulnerability_id == this->prevVulID_) &&
     ((this->v_).intensity_bin_id != this->prevIntBinID_)) {
    CheckIntensityBinID(this);
  }
  if (this->useIndexFile_ == true) {
    (*this->_vptr_ValidateVulnerability[1])(this);
  }
  if (this->allIntensityBinsCheck_ == true) {
    CheckAllIntensityBinsPresent(this);
    return;
  }
  return;
}

Assistant:

void ValidateVulnerability::ReadVulnerabilityFile() {

  OASIS_FLOAT totalProbability = 0.0;
  ReadFirstVulnerabilityLine(totalProbability);
  // Write first vulnerability line
  if (convertToBin_) WriteBinVulnerabilityFile();

  while (fgets(line_, sizeof(line_), stdin) != 0) {

    if (ScanLine() == 4) {

      CheckVulnerabilityID();

      // New vulnerability and/or intensity bin IDs.
      // Check probabilities sum to 1.0  for each vulnerability ID-intensity
      // bin ID combination and intensity bin IDs are contiguous.
      if ((v_.vulnerability_id != prevVulID_) ||
	  (v_.intensity_bin_id != prevIntBinID_)) {

        CheckProbability(totalProbability);
	if (v_.vulnerability_id == prevVulID_) CheckIntensityBinID();
	if (allIntensityBinsCheck_) SetIntensityBinIDs();
	
	if (useIndexFile_) {
	  if (v_.vulnerability_id != prevVulID_) {

	// if new vulnerability ID then write to index file if requested on
	// command line
	  WriteIdxVulnerabilityFile();

	  }
	}

	// Reset for next vulnerability-intensity bin combination
	prevDamageBinID_ = 0;
	totalProbability = v_.probability;

      } else {   // Only damage bin ID changes

	totalProbability += v_.probability;

      }

      CheckDamageBinID();

      if (convertToBin_) {

        WriteBinVulnerabilityFile();

      }

      StoreLine();
      continue;

    }

    fprintf(stderr, "ERROR: Invalid data in line %d:\n%s\n", lineno_, line_);
    PrintErrorMessage();

  }

  // Check probabilities sum to 1.0 for last vulnerability ID-intensity bin ID
  // combination and intensity bin IDs are contguous.
  CheckProbability(totalProbability);
  if ((v_.vulnerability_id == prevVulID_) &&
      (v_.intensity_bin_id != prevIntBinID_)) CheckIntensityBinID();
  // Write last event to index file if requested on command line
  if (useIndexFile_) WriteIdxVulnerabilityFile();

  if (allIntensityBinsCheck_) CheckAllIntensityBinsPresent();

}